

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcgen.cpp
# Opt level: O3

void __thiscall CTcDataStream::alloc_page(CTcDataStream *this)

{
  ulong uVar1;
  size_t __size;
  size_t sVar2;
  char **ppcVar3;
  char *pcVar4;
  ulong uVar5;
  
  sVar2 = this->page_cur_;
  uVar5 = this->page_cnt_;
  uVar1 = sVar2 + 1;
  if (uVar1 < uVar5) {
    this->page_cur_ = uVar1;
    this->wp_ = this->pages_[sVar2 + 1];
    this->rem_ = 65000;
  }
  else {
    uVar1 = this->page_slots_;
    if (uVar5 < uVar1) {
      ppcVar3 = this->pages_;
    }
    else {
      this->page_slots_ = uVar1 + 100;
      __size = uVar1 * 8 + 800;
      if (this->pages_ == (char **)0x0) {
        ppcVar3 = (char **)malloc(__size);
      }
      else {
        ppcVar3 = (char **)realloc(this->pages_,__size);
      }
      this->pages_ = ppcVar3;
      if (ppcVar3 == (char **)0x0) goto LAB_001f47bb;
      uVar5 = this->page_cnt_;
    }
    pcVar4 = (char *)malloc(65000);
    ppcVar3[uVar5] = pcVar4;
    sVar2 = this->page_cnt_;
    if (this->pages_[sVar2] == (char *)0x0) {
LAB_001f47bb:
      err_throw(0x2cec);
    }
    this->wp_ = this->pages_[sVar2];
    this->rem_ = 65000;
    this->page_cur_ = sVar2;
    this->page_cnt_ = sVar2 + 1;
  }
  return;
}

Assistant:

void CTcDataStream::alloc_page()
{
    /* 
     *   if we're coming back to a page that was previously allocated, we
     *   need merely re-establish the existing page 
     */
    if (page_cur_ + 1 < page_cnt_)
    {
        /* move to the next page */
        ++page_cur_;

        /* start writing at the start of the page */
        wp_ = pages_[page_cur_];
        rem_ = TCCS_PAGE_SIZE;

        /* we're done */
        return;
    }

    /* 
     *   if we don't have room for a new page in the page array, expand
     *   the page array 
     */
    if (page_cnt_ >= page_slots_)
    {
        /* increase the page slot count */
        page_slots_ += 100;

        /* allocate or reallocate the page array */
        if (pages_ == 0)
            pages_ = (char **)t3malloc(page_slots_ * sizeof(pages_[0]));
        else
            pages_ = (char **)t3realloc(pages_,
                                        page_slots_ * sizeof(pages_[0]));

        /* if that failed, throw an error */
        if (pages_ == 0)
            err_throw(TCERR_CODEGEN_NO_MEM);
    }

    /* allocate the new page */
    pages_[page_cnt_] = (char *)t3malloc(TCCS_PAGE_SIZE);

    /* throw an error if we couldn't allocate the page */
    if (pages_[page_cnt_] == 0)
        err_throw(TCERR_CODEGEN_NO_MEM);

    /* start writing at the start of the new page */
    wp_ = pages_[page_cnt_];

    /* the entire page is free */
    rem_ = TCCS_PAGE_SIZE;

    /* make the new page the current page */
    page_cur_ = page_cnt_;

    /* count the new page */
    ++page_cnt_;
}